

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetOutputOnly_Test::TestBody(Psbt_SetOutputOnly_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_900;
  Message local_8f8;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_5;
  Message local_8d8;
  string local_8d0;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar_4;
  Message local_898;
  string local_890;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_848 [8];
  Psbt psbt2;
  CryptoUtil local_7e0 [8];
  string b64;
  Message local_7b8;
  ByteData local_7b0;
  string local_798;
  undefined1 local_778 [8];
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CfdException *except_1;
  AssertionResult gtest_ar;
  CfdException *except;
  Amount amount;
  undefined1 local_6f0 [8];
  Address addr2;
  undefined1 local_560 [8];
  Address addr1;
  KeyData key2;
  KeyData key1;
  undefined1 local_140 [8];
  string path2;
  undefined1 local_118 [8];
  string path1;
  undefined1 local_e0 [8];
  HDWallet wallet2;
  undefined1 local_b0 [8];
  HDWallet wallet1;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  Psbt psbt;
  Psbt_SetOutputOnly_Test *this_local;
  
  psbt.base_tx_.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,&local_81);
  cfd::core::Psbt::Psbt((Psbt *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet
            ((HDWallet *)local_b0,
             (ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)((long)&path1.field_2 + 8),&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_e0,(ByteData *)((long)&path1.field_2 + 8));
  cfd::core::ByteData::~ByteData((ByteData *)((long)&path1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_118,"44h/0h/0h/0/2",(allocator *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_140,"44h/0h/0h/0/2",
             (allocator *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_b0,kTestnet,
             (string *)local_118);
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (HDWallet *)local_e0,kTestnet,(string *)local_140);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Address::Address
            ((Address *)local_560,kCfdIllegalArgumentError,kVersion0,
             (Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)&amount.ignore_check_,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Address::Address
            ((Address *)local_6f0,kCfdIllegalArgumentError,kVersion0,(Pubkey *)&amount.ignore_check_
            );
  cfd::core::Pubkey::~Pubkey((Pubkey *)&amount.ignore_check_);
  cfd::core::Amount::Amount((Amount *)&except,100000000);
  cfd::core::Psbt::SetTxOutData
            ((Psbt *)local_60,0,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::SetTxOutData
            ((Psbt *)local_60,1,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Psbt::GetData(&local_7b0,(Psbt *)local_60);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_798,&local_7b0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_778,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_798);
  cfd::core::ByteData::~ByteData(&local_7b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&b64.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x268,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&b64.field_2 + 8),&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&b64.field_2 + 8));
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  cfd::core::Psbt::GetData
            ((ByteData *)
             &psbt2.base_tx_.vout_.
              super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Psbt *)local_60);
  cfd::core::CryptoUtil::EncodeBase64_abi_cxx11_
            (local_7e0,
             (ByteData *)
             &psbt2.base_tx_.vout_.
              super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &psbt2.base_tx_.vout_.
              super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetData((ByteData *)&gtest_ar_3.message_,(Psbt *)local_60);
  cfd::core::Psbt::Psbt((Psbt *)local_848,(ByteData *)&gtest_ar_3.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_3.message_);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_890,(Psbt *)local_60);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_870,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA="
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_890);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar1) {
    testing::Message::Message(&local_898);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x26b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_898);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_8d0,(Psbt *)local_848);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8b0,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA="
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_8d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x26c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8f0,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=\""
             ,"b64.c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA="
             ,pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x26d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_900,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper(&local_900);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  cfd::core::Psbt::~Psbt((Psbt *)local_848);
  std::__cxx11::string::~string((string *)local_7e0);
  cfd::core::Address::~Address((Address *)local_6f0);
  cfd::core::Address::~Address((Address *)local_560);
  cfd::core::KeyData::~KeyData
            ((KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_118);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_e0);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_b0);
  cfd::core::Psbt::~Psbt((Psbt *)local_60);
  return;
}

Assistant:

TEST(Psbt, SetOutputOnly) {
  Psbt psbt("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  Amount amount(100000000);
  try {
    psbt.SetTxOutData(0, key1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    psbt.SetTxOutData(1, key2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000", psbt.GetData().GetHex().c_str());
  auto b64 = CryptoUtil::EncodeBase64(psbt.GetData());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", psbt.GetBase64().c_str());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", psbt2.GetBase64().c_str());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", b64.c_str());
}